

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_list.hpp
# Opt level: O0

int __thiscall
iutest::detail::CountIfOverList<iutest::TestSuite*,bool(iutest::TestSuite::*)()const>
          (detail *this,vector<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_> *list,
          offset_in_TestSuite_to_subr f)

{
  bool bVar1;
  reference ppTVar2;
  ulong uVar3;
  long *plVar4;
  vector<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_> *local_60;
  __normal_iterator<iutest::TestSuite_*const_*,_std::vector<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>_>
  local_48;
  const_iterator end;
  const_iterator it;
  int count;
  offset_in_TestSuite_to_subr f_local;
  vector<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_> *list_local;
  
  it._M_current._4_4_ = 0;
  end = std::vector<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>::begin
                  ((vector<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_> *)this);
  local_48._M_current =
       (TestSuite **)
       std::vector<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>::end
                 ((vector<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_> *)this);
  while (bVar1 = __gnu_cxx::operator!=(&end,&local_48), bVar1) {
    ppTVar2 = __gnu_cxx::
              __normal_iterator<iutest::TestSuite_*const_*,_std::vector<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>_>
              ::operator*(&end);
    plVar4 = (long *)((long)&(*ppTVar2)->_vptr_TestSuite + f);
    local_60 = list;
    if (((ulong)list & 1) != 0) {
      local_60 = *(vector<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_> **)
                  ((long)list + *plVar4 + -1);
    }
    uVar3 = (*(code *)local_60)(plVar4);
    if ((uVar3 & 1) != 0) {
      it._M_current._4_4_ = it._M_current._4_4_ + 1;
    }
    __gnu_cxx::
    __normal_iterator<iutest::TestSuite_*const_*,_std::vector<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>_>
    ::operator++(&end);
  }
  return it._M_current._4_4_;
}

Assistant:

int CountIfOverList(const ::std::vector<T>& list, Fn f)
{
    int count = 0;
    for(typename ::std::vector<T>::const_iterator it = list.begin(), end = list.end(); it != end; ++it)
    {
        if(((*it)->*f)())
        {
            ++count;
        }
    }
    return count;
}